

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     Destroy<duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  long lVar1;
  idx_t i;
  idx_t iVar2;
  
  lVar1 = *(long *)(states + 0x20);
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t>::~ArgMinMaxState
              (*(ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> **)(lVar1 + iVar2 * 8));
  }
  return;
}

Assistant:

static void Destroy(Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
		for (idx_t i = 0; i < count; i++) {
			OP::template Destroy<STATE_TYPE>(*sdata[i], aggr_input_data);
		}
	}